

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentHeader.cpp
# Opt level: O2

void __thiscall
Rml::DocumentHeader::MergePaths
          (DocumentHeader *this,StringList *target,StringList *source,String *source_path)

{
  SystemInterface *pSVar1;
  ulong uVar2;
  long local_118;
  String joined_path;
  String local_d0;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  local_118 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(source->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(source->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    joined_path._M_dataplus._M_p = (pointer)&joined_path.field_2;
    joined_path._M_string_length = 0;
    joined_path.field_2._M_local_buf[0] = '\0';
    pSVar1 = GetSystemInterface();
    ::std::__cxx11::string::string((string *)&local_50,(string *)source_path);
    StringUtilities::Replace(&local_b0,&local_50,'|',':');
    ::std::__cxx11::string::string
              ((string *)&local_d0,
               (string *)
               ((long)&(((source->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + local_118)
              );
    StringUtilities::Replace(&local_70,&local_d0,'|',':');
    (*pSVar1->_vptr_SystemInterface[4])(pSVar1,&joined_path,&local_b0,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::string((string *)&local_90,(string *)&joined_path);
    StringUtilities::Replace(&local_b0,&local_90,':','|');
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)target,&local_b0
              );
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&joined_path);
    local_118 = local_118 + 0x20;
  }
  return;
}

Assistant:

void DocumentHeader::MergePaths(StringList& target, const StringList& source, const String& source_path)
{
	for (size_t i = 0; i < source.size(); i++)
	{
		String joined_path;
		::Rml::GetSystemInterface()->JoinPath(joined_path, StringUtilities::Replace(source_path, '|', ':'),
			StringUtilities::Replace(source[i], '|', ':'));

		target.push_back(StringUtilities::Replace(joined_path, ':', '|'));
	}
}